

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall fixedMeasurement_opsV2_Test::TestBody(fixedMeasurement_opsV2_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  fixed_measurement *val;
  char *in_R9;
  AssertHelper local_558;
  Message local_550;
  double local_548;
  double local_540;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_6;
  fixed_measurement v;
  Message local_510;
  double local_508;
  double local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_5;
  Message local_4e0;
  double local_4d8;
  double local_4d0;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_4;
  fixed_measurement fm3;
  AssertHelper local_488;
  Message local_480;
  measurement local_478;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_430;
  Message local_428;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__6;
  measurement m3;
  fixed_measurement spd;
  measurement m1;
  AssertHelper local_3b8;
  Message local_3b0;
  unit local_3a4;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__5;
  Message local_380;
  double local_378;
  double local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_348 [8];
  measurement rat;
  AssertHelper local_318;
  Message local_310;
  unit local_304;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__4;
  Message local_2e0;
  double local_2d8;
  double local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_2a8 [8];
  fixed_measurement diff;
  AssertHelper local_278;
  Message local_270;
  measurement local_268;
  fixed_measurement local_258;
  measurement local_248;
  fixed_measurement local_238;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f0;
  Message local_1e8;
  unit local_1dc;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__2;
  Message local_1b8;
  double local_1b0;
  double local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_180 [8];
  fixed_measurement sum;
  AssertHelper local_150;
  Message local_148;
  measurement local_140;
  measurement local_130;
  measurement local_120;
  measurement local_110;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  unit local_b4;
  unit local_ac;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Message local_88 [3];
  double local_70;
  double local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  measurement area;
  fixed_measurement d2;
  fixed_measurement d1;
  fixedMeasurement_opsV2_Test *this_local;
  
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&d2.units_,45.0,(unit *)&units::m);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&area.units_,79.0,(unit *)&units::m);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator_cast_to_measurement((fixed_measurement *)&area.units_);
  _local_40 = units::fixed_measurement::operator*
                        ((fixed_measurement *)&d2.units_,(measurement *)&gtest_ar.message_);
  local_68 = units::measurement::value((measurement *)local_40);
  local_70 = 3555.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_60,"area.value()","45.0 * 79",&local_68,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_ac = units::measurement::units((measurement *)local_40);
  local_b4 = units::unit::operator*((unit *)&units::m,(unit *)&units::m);
  local_a1 = units::unit::operator==(&local_ac,&local_b4);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_a0,
               (AssertionResult *)"area.units() == m * m","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_120 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&area.units_);
  local_110 = units::fixed_measurement::operator*((fixed_measurement *)&d2.units_,&local_120);
  local_140 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&d2.units_);
  local_130 = units::fixed_measurement::operator*((fixed_measurement *)&area.units_,&local_140);
  local_f9 = units::measurement::operator==(&local_110,&local_130);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.units_,(internal *)local_f8,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&sum.units_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator_cast_to_measurement((fixed_measurement *)&area.units_);
  units::fixed_measurement::operator+((fixed_measurement *)local_180,(measurement *)&d2.units_);
  local_1a8 = units::fixed_measurement::value((fixed_measurement *)local_180);
  local_1b0 = 124.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1a0,"sum.value()","45.0 + 79.0",&local_1a8,&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1dc = units::fixed_measurement::units((fixed_measurement *)local_180);
  local_1d1 = units::unit::operator==(&local_1dc,(unit *)&units::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1d0,
               (AssertionResult *)"sum.units() == m","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_248 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&area.units_);
  units::fixed_measurement::operator+(&local_238,(measurement *)&d2.units_);
  local_268 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&d2.units_);
  units::fixed_measurement::operator+(&local_258,(measurement *)&area.units_);
  local_221 = units::fixed_measurement::operator==(&local_238,&local_258);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&diff.units_,(internal *)local_220,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x107,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&diff.units_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator_cast_to_measurement((fixed_measurement *)&d2.units_);
  units::fixed_measurement::operator-((fixed_measurement *)local_2a8,(measurement *)&area.units_);
  local_2d0 = units::fixed_measurement::value((fixed_measurement *)local_2a8);
  local_2d8 = 34.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2c8,"diff.value()","79.0 - 45",&local_2d0,&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_304 = units::fixed_measurement::units((fixed_measurement *)local_2a8);
  local_2f9 = units::unit::operator==(&local_304,(unit *)&units::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rat.units_,(internal *)local_2f8,(AssertionResult *)"diff.units() == m",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&rat.units_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator_cast_to_measurement((fixed_measurement *)&area.units_);
  _local_348 = units::fixed_measurement::operator/
                         ((fixed_measurement *)&d2.units_,(measurement *)&gtest_ar_3.message_);
  local_370 = units::measurement::value((measurement *)local_348);
  local_378 = 0.569620253164557;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_368,"rat.value()","45.0 / 79",&local_370,&local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  local_3a4 = units::measurement::units((measurement *)local_348);
  local_399 = units::unit::operator==(&local_3a4,(unit *)&units::ratio);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_398,&local_399,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&m1.units_,(internal *)local_398,(AssertionResult *)"rat.units() == ratio",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&m1.units_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator/((fixed_measurement *)&area.units_,(unit *)&units::s);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&m3.units_,(measurement *)&spd.units_);
  join_0x00000000_0x00001200_ =
       units::fixed_measurement::operator*((fixed_measurement *)&m3.units_,(unit *)&units::s);
  local_419 = units::fixed_measurement::operator==
                        ((fixed_measurement *)&area.units_,(measurement *)&gtest_ar__6.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_418,(AssertionResult *)"d2 == m3",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_478 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&area.units_);
  local_461 = units::measurement::operator==((measurement *)&gtest_ar__6.message_,&local_478);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_460,&local_461,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fm3.units_,(internal *)local_460,(AssertionResult *)"m3 == d2","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    std::__cxx11::string::~string((string *)&fm3.units_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  this_00 = &gtest_ar_4.message_;
  units::fixed_measurement::fixed_measurement((fixed_measurement *)this_00,2.0,(unit *)&units::m);
  units::fixed_measurement::operator*=((fixed_measurement *)this_00,2.0);
  local_4d0 = units::fixed_measurement::value((fixed_measurement *)this_00);
  local_4d8 = 4.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4c8,"fm3.value()","4.0",&local_4d0,&local_4d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  units::fixed_measurement::operator/=((fixed_measurement *)&gtest_ar_4.message_,4.0);
  local_500 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_4.message_);
  local_508 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_4f8,"fm3.value()","1.0",&local_500,&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v.units_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v.units_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  val = units::fixed_measurement::operator*=((fixed_measurement *)&gtest_ar_4.message_,2.0);
  units::fixed_measurement::fixed_measurement((fixed_measurement *)&gtest_ar_6.message_,val);
  local_540 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_6.message_);
  local_548 = 2.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_538,"v.value()","2.0",&local_540,&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  return;
}

Assistant:

TEST(fixedMeasurement, opsV2)
{
    fixed_measurement d1(45.0, m);
    fixed_measurement d2(79, m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    auto m1 = d2 / s;
    fixed_measurement spd(m1);
    auto m3 = spd * s;

    EXPECT_TRUE(d2 == m3);
    EXPECT_TRUE(m3 == d2);

    fixed_measurement fm3(2.0, m);
    fm3 *= 2.0;
    EXPECT_EQ(fm3.value(), 4.0);
    fm3 /= 4.0;
    EXPECT_EQ(fm3.value(), 1.0);

    auto v = fm3 *= 2.0;
    EXPECT_EQ(v.value(), 2.0);
}